

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O1

array<char,_22UL> * convertToPrintString(array<char,_22UL> *__return_storage_ptr__,int64_t val)

{
  double dVar1;
  char *__format;
  
  __return_storage_ptr__->_M_elems[0] = '\0';
  __return_storage_ptr__->_M_elems[1] = '\0';
  __return_storage_ptr__->_M_elems[2] = '\0';
  __return_storage_ptr__->_M_elems[3] = '\0';
  __return_storage_ptr__->_M_elems[4] = '\0';
  __return_storage_ptr__->_M_elems[5] = '\0';
  __return_storage_ptr__->_M_elems[6] = '\0';
  __return_storage_ptr__->_M_elems[7] = '\0';
  __return_storage_ptr__->_M_elems[8] = '\0';
  __return_storage_ptr__->_M_elems[9] = '\0';
  __return_storage_ptr__->_M_elems[10] = '\0';
  __return_storage_ptr__->_M_elems[0xb] = '\0';
  __return_storage_ptr__->_M_elems[0xc] = '\0';
  __return_storage_ptr__->_M_elems[0xd] = '\0';
  __return_storage_ptr__->_M_elems[0xe] = '\0';
  __return_storage_ptr__->_M_elems[0xf] = '\0';
  __return_storage_ptr__->_M_elems[0xe] = '\0';
  __return_storage_ptr__->_M_elems[0xf] = '\0';
  __return_storage_ptr__->_M_elems[0x10] = '\0';
  __return_storage_ptr__->_M_elems[0x11] = '\0';
  __return_storage_ptr__->_M_elems[0x12] = '\0';
  __return_storage_ptr__->_M_elems[0x13] = '\0';
  __return_storage_ptr__->_M_elems[0x14] = '\0';
  __return_storage_ptr__->_M_elems[0x15] = '\0';
  dVar1 = (double)val;
  if (dVar1 <= 1.0) {
    dVar1 = 1.0;
  }
  dVar1 = log10(dVar1);
  if ((uint)(int)dVar1 < 6) {
    __format = "%ld";
  }
  else if ((int)dVar1 - 6U < 3) {
    val = val / 1000;
    __format = "%ldk";
  }
  else {
    val = val / 1000000;
    __format = "%ldm";
  }
  snprintf(__return_storage_ptr__->_M_elems,0x16,__format,val);
  return __return_storage_ptr__;
}

Assistant:

static std::array<char, 22> convertToPrintString(int64_t val) {
  decltype(convertToPrintString(std::declval<int64_t>())) printString = {};
  double l = std::log10(std::max(1.0, double(val)));
  switch (int(l)) {
    case 0:
    case 1:
    case 2:
    case 3:
    case 4:
    case 5:
      std::snprintf(printString.data(), printString.size(), "%" PRId64, val);
      break;
    case 6:
    case 7:
    case 8:
      std::snprintf(printString.data(), printString.size(), "%" PRId64 "k",
                    val / 1000);
      break;
    default:
      std::snprintf(printString.data(), printString.size(), "%" PRId64 "m",
                    val / 1000000);
  }

  return printString;
}